

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O1

void crnlib::end_zero_run(uint *size,vector<unsigned_short> *codes)

{
  uint uVar1;
  uint uVar2;
  short sVar3;
  unsigned_short uVar4;
  
  uVar2 = *size;
  if (uVar2 != 0) {
    if (uVar2 < 3) {
      while (uVar1 = *size, *size = *size - 1, uVar1 != 0) {
        if (codes->m_capacity <= codes->m_size) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)codes,codes->m_size + 1,true,2,(object_mover)0x0,false);
        }
        codes->m_p[codes->m_size] = 0;
        codes->m_size = codes->m_size + 1;
      }
    }
    else {
      sVar3 = (short)uVar2 * 0x100;
      if (uVar2 < 0xb) {
        uVar4 = sVar3 - 0x2ef;
      }
      else {
        uVar4 = sVar3 - 0xaee;
      }
      if (codes->m_capacity <= codes->m_size) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)codes,codes->m_size + 1,true,2,(object_mover)0x0,false);
      }
      codes->m_p[codes->m_size] = uVar4;
      codes->m_size = codes->m_size + 1;
    }
    *size = 0;
  }
  return;
}

Assistant:

static inline void end_zero_run(uint& size, crnlib::vector<uint16>& codes)
    {
        if (!size)
        {
            return;
        }

        if (size < cMinSmallZeroRunSize)
        {
            while (size--)
            {
                codes.push_back(0);
            }
        }
        else if (size <= cMaxSmallZeroRunSize)
        {
            codes.push_back(static_cast<uint16>(cSmallZeroRunCode | ((size - cMinSmallZeroRunSize) << 8)));
        }
        else
        {
            CRNLIB_ASSERT((size >= cMinLargeZeroRunSize) && (size <= cMaxLargeZeroRunSize));
            codes.push_back(static_cast<uint16>(cLargeZeroRunCode | ((size - cMinLargeZeroRunSize) << 8)));
        }

        size = 0;
    }